

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_extensions.cpp
# Opt level: O0

bool spvtools::val::anon_unknown_0::IsConstWithIntScalarType
               (ValidationState_t *_,Instruction *inst,uint32_t word_index)

{
  bool bVar1;
  uint32_t uVar2;
  Op OVar3;
  Instruction *this;
  Instruction *int_scalar_const;
  uint32_t word_index_local;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  uVar2 = Instruction::word(inst,(ulong)word_index);
  this = ValidationState_t::FindDef(_,uVar2);
  OVar3 = Instruction::opcode(this);
  if (OVar3 == OpConstant) {
    uVar2 = Instruction::type_id(this);
    bVar1 = ValidationState_t::IsIntScalarType(_,uVar2);
    if (bVar1) {
      return true;
    }
  }
  return false;
}

Assistant:

bool IsConstWithIntScalarType(ValidationState_t& _, const Instruction* inst,
                              uint32_t word_index) {
  auto* int_scalar_const = _.FindDef(inst->word(word_index));
  if (int_scalar_const->opcode() == spv::Op::OpConstant &&
      _.IsIntScalarType(int_scalar_const->type_id())) {
    return true;
  }
  return false;
}